

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

void httpmsg_init(http_message_t *msg)

{
  msg->initialized = 1;
  (msg->entity).buf = (char *)0x0;
  (msg->entity).length = 0;
  ListInit(&msg->headers,httpmsg_compare,httpheader_free);
  membuffer_init(&msg->msg);
  membuffer_init(&msg->status_msg);
  return;
}

Assistant:

void httpmsg_init(http_message_t *msg)
{
	msg->initialized = 1;
	msg->entity.buf = NULL;
	msg->entity.length = (size_t)0;
	ListInit(&msg->headers, httpmsg_compare, httpheader_free);
	membuffer_init(&msg->msg);
	membuffer_init(&msg->status_msg);
}